

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

void duckdb::
     HistogramUpdateFunction<duckdb::HistogramFunctor,signed_char,duckdb::DefaultMapType<std::unordered_map<signed_char,unsigned_long,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<std::pair<signed_char_const,unsigned_long>>>>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  long *plVar1;
  ulong uVar2;
  _Map_base<signed_char,_std::pair<const_signed_char,_unsigned_long>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this;
  mapped_type *pmVar3;
  idx_t i;
  ulong uVar4;
  ulong uVar5;
  UnifiedVectorFormat input_data;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(inputs,count,&local_c0);
  for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
    uVar5 = uVar4;
    if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
      uVar5 = (ulong)(local_c0.sel)->sel_vector[uVar4];
    }
    if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6] >>
         (uVar5 & 0x3f) & 1) != 0)) {
      uVar2 = uVar4;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)(local_78.sel)->sel_vector[uVar4];
      }
      plVar1 = *(long **)(local_78.data + uVar2 * 8);
      this = (_Map_base<signed_char,_std::pair<const_signed_char,_unsigned_long>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)*plVar1;
      if (this == (_Map_base<signed_char,_std::pair<const_signed_char,_unsigned_long>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)0x0) {
        this = (_Map_base<signed_char,_std::pair<const_signed_char,_unsigned_long>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)DefaultMapType<std::unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>_>
                  ::CreateEmpty(aggr_input->allocator);
        *plVar1 = (long)this;
      }
      pmVar3 = ::std::__detail::
               _Map_base<signed_char,_std::pair<const_signed_char,_unsigned_long>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](this,(key_type *)(local_c0.data + uVar5));
      *pmVar3 = *pmVar3 + 1;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

static void HistogramUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                    Vector &state_vector, idx_t count) {

	D_ASSERT(input_count == 1);

	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, typename MAP_TYPE::MAP_TYPE> *>(sdata);
	auto input_values = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			state.hist = MAP_TYPE::CreateEmpty(aggr_input.allocator);
		}
		auto &input_value = input_values[idx];
		++(*state.hist)[input_value];
	}
}